

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

void gl4cts::GLSL420Pack::Utils::replaceAllTokens(GLchar *token,GLchar *text,string *string)

{
  char *pcVar1;
  ulong uVar2;
  
  strlen(text);
  pcVar1 = (char *)strlen(token);
  while( true ) {
    uVar2 = std::__cxx11::string::find((char *)string,(ulong)token);
    if (uVar2 == 0xffffffffffffffff) break;
    std::__cxx11::string::replace((ulong)string,uVar2,pcVar1,(ulong)text);
  }
  return;
}

Assistant:

void Utils::replaceAllTokens(const glw::GLchar* token, const glw::GLchar* text, std::string& string)
{
	const size_t text_length  = strlen(text);
	const size_t token_length = strlen(token);

	size_t search_position = 0;

	while (1)
	{
		const size_t token_position = string.find(token, search_position);

		if (std::string::npos == token_position)
		{
			break;
		}

		search_position = token_position + text_length;

		string.replace(token_position, token_length, text, text_length);
	}
}